

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_GMAA_MAAstar.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  size_t h;
  size_t h_00;
  ProblemDecTiger pdt;
  ProblemDecTiger local_280;
  
  ProblemDecTiger::ProblemDecTiger(&local_280);
  h_00 = 1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---------------------------------------",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"------gmaa MAA* QBG  -horizon=",0x1e);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-------",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    TestGMAA_MAAstar(h_00,&local_280.super_DecPOMDPDiscrete,eQBG);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---------------------------------------",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"------gmaa MAA* QPOMDP  -horizon=",0x21);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"----",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    TestGMAA_MAAstar(h_00,&local_280.super_DecPOMDPDiscrete,eQPOMDP);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---------------------------------------",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"------gmaa MAA* QMDP  -horizon=",0x1f);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"------",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    TestGMAA_MAAstar(h_00,&local_280.super_DecPOMDPDiscrete,eQMDP);
    h_00 = h_00 + 1;
  } while (h_00 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\nTotal ticks ",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," clock ticks = ",0xf);
  poVar1 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Total utime = ",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," clock ticks = ",0xf);
  poVar1 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  DecPOMDPDiscrete::~DecPOMDPDiscrete(&local_280.super_DecPOMDPDiscrete);
  return 0;
}

Assistant:

int main()
{    
    ProblemDecTiger pdt;

    for(size_t h = 1; h < 4; h++)
    {

        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QBG  -horizon="<<h<<"-------"<<endl;
        TestGMAA_MAAstar(h, pdt, eQBG);        
        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QPOMDP  -horizon="<<h<<"----"<<endl;
        TestGMAA_MAAstar(h, pdt, eQPOMDP);
        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QMDP  -horizon="<<h<<"------"<<endl;
        TestGMAA_MAAstar(h, pdt, eQMDP);
    }
    
    cout << "\n\nTotal ticks "<< tot_ticks << " clock ticks = " << 
        (double)(tot_ticks) / cps <<"s" << endl <<
        "Total utime = "<< tot_utime << " clock ticks = "<< 
        (double (tot_utime))/ cps << "s" << endl;
}